

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_skip_backup_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string local_100;
  byte local_d9;
  string local_d8;
  byte local_b7;
  byte local_b6;
  byte local_b5;
  byte local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint32_t local_1c;
  InputAPI *pIStack_18;
  uint32_t ind_local;
  InputAPI *this_local;
  
  local_a1 = 0;
  local_b5 = 0;
  local_b6 = 0;
  local_b7 = 0;
  local_d9 = 0;
  local_1c = ind;
  pIStack_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_a0,(re2c *)(ulong)ind,ind);
    local_a1 = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_80,&local_a0,&poVar1->yymarker);
    local_b5 = 1;
    std::operator+(&local_60,&local_80," = ++");
    local_b6 = 1;
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_40,&local_60,&poVar1->yycursor);
    local_b7 = 1;
    std::operator+(__return_storage_ptr__,&local_40,";\n");
  }
  else {
    stmt_skip_abi_cxx11_(&local_d8,this,ind);
    local_d9 = 1;
    stmt_backup_abi_cxx11_(&local_100,this,local_1c);
    std::operator+(__return_storage_ptr__,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if ((local_d9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((local_b7 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_b6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_b5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_backup (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yymarker + " = ++" + opts->yycursor + ";\n"
		: stmt_skip (ind) + stmt_backup (ind);
}